

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

int Llb_NonlinStart(Llb_Mgr_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  DdNode *bFunc;
  int i;
  
  p_00 = Llb_NonlinBuildBdds(p->pAig,p->vLeaves,p->vRoots,p->dd);
  if (p_00 == (Vec_Ptr_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = p_00->nSize;
    i = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
      i = 0;
    }
    for (; iVar1 != i; i = i + 1) {
      bFunc = (DdNode *)Vec_PtrEntry(p_00,i);
      Llb_NonlinAddPartition(p,i,bFunc);
    }
    Vec_PtrFree(p_00);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Llb_NonlinStart( Llb_Mgr_t * p )
{
    Vec_Ptr_t * vRootBdds;
    DdNode * bFunc;
    int i;
    // create and collect BDDs
    vRootBdds = Llb_NonlinBuildBdds( p->pAig, p->vLeaves, p->vRoots, p->dd ); // come referenced
    if ( vRootBdds == NULL )
        return 0;
    // add pairs (refs are consumed inside)
    Vec_PtrForEachEntry( DdNode *, vRootBdds, bFunc, i )
        Llb_NonlinAddPartition( p, i, bFunc );
    Vec_PtrFree( vRootBdds );
    return 1;
}